

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O0

void __thiscall
DescriptorKeyInfo_Constructor_Pubkey_Test::TestBody(DescriptorKeyInfo_Constructor_Pubkey_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  char *in_R9;
  AssertHelper local_868;
  Message local_860;
  string local_858;
  Pubkey local_838;
  string local_820;
  undefined1 local_800 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_7d0;
  Message local_7c8;
  bool local_7b9;
  undefined1 local_7b8 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_788;
  Message local_780;
  bool local_771;
  undefined1 local_770 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_740;
  Message local_738;
  bool local_729;
  undefined1 local_728 [8];
  AssertionResult gtest_ar_;
  Message local_710;
  string local_708;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e8;
  undefined1 local_6c8 [8];
  AssertionResult gtest_ar_2;
  Message local_6b0;
  string local_6a8;
  AssertHelper local_688;
  Message local_680;
  string local_678;
  DescriptorKeyInfo local_658;
  AssertHelper local_4b8;
  Message local_4b0;
  DescriptorKeyType local_4a8;
  DescriptorKeyType local_4a4;
  undefined1 local_4a0 [8];
  AssertionResult gtest_ar_1;
  Message local_488;
  string local_480;
  undefined1 local_460 [8];
  AssertionResult gtest_ar;
  Message local_448;
  string local_440;
  AssertHelper local_420;
  Message local_418;
  allocator local_409;
  string local_408;
  DescriptorKeyInfo local_3e8;
  string local_248 [8];
  string key_str;
  DescriptorKeyInfo key_info;
  undefined1 local_80 [8];
  string parent_info;
  allocator local_49;
  string local_48;
  undefined1 local_28 [8];
  Pubkey pubkey;
  DescriptorKeyInfo_Constructor_Pubkey_Test *this_local;
  
  pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_48,
             "03d3f817091de0bbe51e19b53303b12e463f664894d49cb5bf5bb19c88fbc54d8d",&local_49);
  cfd::core::Pubkey::Pubkey((Pubkey *)local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_80,"[ef57314e/0\'/0\'/4\']",
             (allocator *)(key_info.key_string_.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator
            ((allocator<char> *)(key_info.key_string_.field_2._M_local_buf + 0xf));
  cfd::core::DescriptorKeyInfo::DescriptorKeyInfo((DescriptorKeyInfo *)((long)&key_str.field_2 + 8))
  ;
  std::__cxx11::string::string(local_248);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_408,"",&local_409);
      cfd::core::DescriptorKeyInfo::DescriptorKeyInfo(&local_3e8,(Pubkey *)local_28,&local_408);
      cfd::core::DescriptorKeyInfo::operator=
                ((DescriptorKeyInfo *)((long)&key_str.field_2 + 8),&local_3e8);
      cfd::core::DescriptorKeyInfo::~DescriptorKeyInfo(&local_3e8);
      std::__cxx11::string::~string((string *)&local_408);
      std::allocator<char>::~allocator((allocator<char> *)&local_409);
    }
  }
  else {
    testing::Message::Message(&local_418);
    testing::internal::AssertHelper::AssertHelper
              (&local_420,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x53d,
               "Expected: key_info = DescriptorKeyInfo(pubkey) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_420,&local_418);
    testing::internal::AssertHelper::~AssertHelper(&local_420);
    testing::Message::~Message(&local_418);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::DescriptorKeyInfo::ToString_abi_cxx11_
                (&local_440,(DescriptorKeyInfo *)((long)&key_str.field_2 + 8));
      std::__cxx11::string::operator=(local_248,(string *)&local_440);
      std::__cxx11::string::~string((string *)&local_440);
    }
  }
  else {
    testing::Message::Message(&local_448);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x53e,
               "Expected: key_str = key_info.ToString() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,&local_448);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(&local_448);
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::Pubkey::GetHex_abi_cxx11_(&local_480,(Pubkey *)local_28);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_460,"key_str.c_str()","pubkey.GetHex().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_480);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_460);
  if (!bVar1) {
    testing::Message::Message(&local_488);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_460);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x53f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_488);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_488);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_460);
  local_4a4 = cfd::core::DescriptorKeyInfo::GetKeyType
                        ((DescriptorKeyInfo *)((long)&key_str.field_2 + 8));
  local_4a8 = kDescriptorKeyPublic;
  testing::internal::EqHelper<false>::
  Compare<cfd::core::DescriptorKeyType,cfd::core::DescriptorKeyType>
            ((EqHelper<false> *)local_4a0,"key_info.GetKeyType()",
             "DescriptorKeyType::kDescriptorKeyPublic",&local_4a4,&local_4a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4a0);
  if (!bVar1) {
    testing::Message::Message(&local_4b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4a0);
    testing::internal::AssertHelper::AssertHelper
              (&local_4b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x540,pcVar2);
    testing::internal::AssertHelper::operator=(&local_4b8,&local_4b0);
    testing::internal::AssertHelper::~AssertHelper(&local_4b8);
    testing::Message::~Message(&local_4b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_678,(string *)local_80);
      cfd::core::DescriptorKeyInfo::DescriptorKeyInfo(&local_658,(Pubkey *)local_28,&local_678);
      cfd::core::DescriptorKeyInfo::operator=
                ((DescriptorKeyInfo *)((long)&key_str.field_2 + 8),&local_658);
      cfd::core::DescriptorKeyInfo::~DescriptorKeyInfo(&local_658);
      std::__cxx11::string::~string((string *)&local_678);
    }
  }
  else {
    testing::Message::Message(&local_680);
    testing::internal::AssertHelper::AssertHelper
              (&local_688,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x542,
               "Expected: key_info = DescriptorKeyInfo(pubkey, parent_info) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_688,&local_680);
    testing::internal::AssertHelper::~AssertHelper(&local_688);
    testing::Message::~Message(&local_680);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::DescriptorKeyInfo::ToString_abi_cxx11_
                (&local_6a8,(DescriptorKeyInfo *)((long)&key_str.field_2 + 8));
      std::__cxx11::string::operator=(local_248,(string *)&local_6a8);
      std::__cxx11::string::~string((string *)&local_6a8);
    }
  }
  else {
    testing::Message::Message(&local_6b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x543,
               "Expected: key_str = key_info.ToString() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_6b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_6b0);
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::Pubkey::GetHex_abi_cxx11_(&local_708,(Pubkey *)local_28);
  std::operator+(&local_6e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                 &local_708);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_6c8,"key_str.c_str()","(parent_info + pubkey.GetHex()).c_str()",
             pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_6e8);
  std::__cxx11::string::~string((string *)&local_708);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6c8);
  if (!bVar1) {
    testing::Message::Message(&local_710);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x544,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_710);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_710);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6c8);
  bVar1 = cfd::core::DescriptorKeyInfo::HasPrivkey
                    ((DescriptorKeyInfo *)((long)&key_str.field_2 + 8));
  local_729 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_728,&local_729,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_728);
  if (!bVar1) {
    testing::Message::Message(&local_738);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_728,
               (AssertionResult *)"key_info.HasPrivkey()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_740,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x545,pcVar2);
    testing::internal::AssertHelper::operator=(&local_740,&local_738);
    testing::internal::AssertHelper::~AssertHelper(&local_740);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_738);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_728);
  bVar1 = cfd::core::DescriptorKeyInfo::HasExtPubkey
                    ((DescriptorKeyInfo *)((long)&key_str.field_2 + 8));
  local_771 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_770,&local_771,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_770);
  if (!bVar1) {
    testing::Message::Message(&local_780);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_770,
               (AssertionResult *)"key_info.HasExtPubkey()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_788,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x546,pcVar2);
    testing::internal::AssertHelper::operator=(&local_788,&local_780);
    testing::internal::AssertHelper::~AssertHelper(&local_788);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_780);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_770);
  bVar1 = cfd::core::DescriptorKeyInfo::HasExtPrivkey
                    ((DescriptorKeyInfo *)((long)&key_str.field_2 + 8));
  local_7b9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_7b8,&local_7b9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7b8);
  if (!bVar1) {
    testing::Message::Message(&local_7c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_3.message_,(internal *)local_7b8,
               (AssertionResult *)"key_info.HasExtPrivkey()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_7d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x547,pcVar2);
    testing::internal::AssertHelper::operator=(&local_7d0,&local_7c8);
    testing::internal::AssertHelper::~AssertHelper(&local_7d0);
    std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_7c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7b8);
  cfd::core::DescriptorKeyInfo::GetPubkey
            (&local_838,(DescriptorKeyInfo *)((long)&key_str.field_2 + 8));
  cfd::core::Pubkey::GetHex_abi_cxx11_(&local_820,&local_838);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::Pubkey::GetHex_abi_cxx11_(&local_858,(Pubkey *)local_28);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_800,"key_info.GetPubkey().GetHex().c_str()","pubkey.GetHex().c_str()"
             ,pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_858);
  std::__cxx11::string::~string((string *)&local_820);
  cfd::core::Pubkey::~Pubkey(&local_838);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_800);
  if (!bVar1) {
    testing::Message::Message(&local_860);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_800);
    testing::internal::AssertHelper::AssertHelper
              (&local_868,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_descriptor.cpp"
               ,0x548,pcVar2);
    testing::internal::AssertHelper::operator=(&local_868,&local_860);
    testing::internal::AssertHelper::~AssertHelper(&local_868);
    testing::Message::~Message(&local_860);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_800);
  std::__cxx11::string::~string(local_248);
  cfd::core::DescriptorKeyInfo::~DescriptorKeyInfo
            ((DescriptorKeyInfo *)((long)&key_str.field_2 + 8));
  std::__cxx11::string::~string((string *)local_80);
  cfd::core::Pubkey::~Pubkey((Pubkey *)local_28);
  return;
}

Assistant:

TEST(DescriptorKeyInfo, Constructor_Pubkey) {
  Pubkey pubkey("03d3f817091de0bbe51e19b53303b12e463f664894d49cb5bf5bb19c88fbc54d8d");
  std::string parent_info = "[ef57314e/0'/0'/4']";
  DescriptorKeyInfo key_info;
  std::string key_str;

  EXPECT_NO_THROW(key_info = DescriptorKeyInfo(pubkey));
  EXPECT_NO_THROW(key_str = key_info.ToString());
  EXPECT_STREQ(key_str.c_str(), pubkey.GetHex().c_str());
  EXPECT_EQ(key_info.GetKeyType(),  DescriptorKeyType::kDescriptorKeyPublic);

  EXPECT_NO_THROW(key_info = DescriptorKeyInfo(pubkey, parent_info));
  EXPECT_NO_THROW(key_str = key_info.ToString());
  EXPECT_STREQ(key_str.c_str(), (parent_info + pubkey.GetHex()).c_str());
  EXPECT_FALSE(key_info.HasPrivkey());
  EXPECT_FALSE(key_info.HasExtPubkey());
  EXPECT_FALSE(key_info.HasExtPrivkey());
  EXPECT_STREQ(key_info.GetPubkey().GetHex().c_str(),  pubkey.GetHex().c_str());
}